

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O2

void __thiscall Application::printHelp(Application *this)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Keyboard actions :");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"* Escape      : Exit App");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"* H           : This help menu");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "* Right/Left  : Select next/previous joystick among the FF capable detected ones"
                          );
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,
                           "* Up/Down     : Select next/previous effect for the selected joystick");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"* PgUp/PgDn   : Increase/decrease from 5% the master gain ");
  poVar1 = std::operator<<(poVar1,"for all the joysticks");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"* Space       : Toggle auto-centering on all the joysticks");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (this->_bIsInitialized == true) {
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<(poVar1,"Implemented effects :");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    EffectManager::printEffects(this->_pEffectMgr);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  return;
}

Assistant:

void printHelp()
	{
		cout << endl
			 << "Keyboard actions :" << endl
			 << "* Escape      : Exit App" << endl
			 << "* H           : This help menu" << endl
			 << "* Right/Left  : Select next/previous joystick among the FF capable detected ones" << endl
			 << "* Up/Down     : Select next/previous effect for the selected joystick" << endl
			 << "* PgUp/PgDn   : Increase/decrease from 5% the master gain "
			 << "for all the joysticks" << endl
			 << "* Space       : Toggle auto-centering on all the joysticks" << endl;
		if(_bIsInitialized)
		{
			cout << endl
				 << "Implemented effects :" << endl
				 << endl;
			_pEffectMgr->printEffects();
			cout << endl;
		}
	}